

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

qcc_generator_ptr qcc_gen_one_of(qcc_context *ctx,...)

{
  char in_AL;
  qcc_generator_ptr pqVar1;
  void **ppvVar2;
  void *pvVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  qcc_generator_ptr gen;
  void **local_e0;
  void *local_d0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  pqVar1 = (qcc_generator_ptr)qcc_arena_alloc(ctx->arena,0x28);
  pqVar1->context = ctx;
  pqVar1->type_size = 0;
  pqVar1->generate = qcc_generate_one_of;
  *(undefined4 *)&pqVar1[1].context = 0;
  local_e0 = &args[0].overflow_arg_area;
  uVar4 = 8;
  qcc_arena_begin_array(ctx->arena);
  while( true ) {
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      ppvVar2 = (void **)((long)local_c8 + uVar5);
    }
    else {
      ppvVar2 = local_e0;
      local_e0 = local_e0 + 1;
    }
    local_d0 = *ppvVar2;
    if (local_d0 == (void *)0x0) break;
    if (pqVar1->type_size == 0) {
      pqVar1->type_size = *(size_t *)((long)local_d0 + 8);
    }
    else if (pqVar1->type_size != *(size_t *)((long)local_d0 + 8)) {
      __assert_fail("res->base.type_size == gen->type_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/src/generator.c"
                    ,0x5a,"qcc_generator_ptr qcc_gen_one_of(struct qcc_context *, ...)");
    }
    *(int *)&pqVar1[1].context = *(int *)&pqVar1[1].context + 1;
    qcc_arena_append_array(ctx->arena,&local_d0,8);
  }
  pvVar3 = qcc_arena_end_array(ctx->arena);
  pqVar1[1].type_size = (size_t)pvVar3;
  return pqVar1;
}

Assistant:

qcc_generator_ptr qcc_gen_one_of(struct qcc_context *ctx, ...)
{
    QCC_ARENA_POD(ctx->arena, qcc_generator_one_of, res);
    res->base.context = ctx;
    res->base.type_size = 0;
    res->base.generate = qcc_generate_one_of;
    res->generator_count = 0;

    va_list args;
    va_start(args, ctx);
    qcc_arena_begin_array(ctx->arena);
    while (1)
    {
        qcc_generator_ptr gen = va_arg(args, qcc_generator_ptr);
        if (!gen) break;

        if (res->base.type_size)
            assert(res->base.type_size == gen->type_size);
        else
            res->base.type_size = gen->type_size;

        ++res->generator_count;
        qcc_arena_append_array(ctx->arena, &gen, sizeof(gen));
    }
    va_end(args);
    res->generators = (qcc_generator_ptr *)qcc_arena_end_array(ctx->arena);

    return &res->base;
}